

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternAddressMapper.cpp
# Opt level: O3

void __thiscall
PatternAddressMapper::export_pattern
          (PatternAddressMapper *this,vector<Aggressor,_std::allocator<Aggressor>_> *aggressors,
          int base_period,vector<volatile_char_*,_std::allocator<volatile_char_*>_> *addresses)

{
  undefined1 auStack_28 [8];
  vector<int,_std::allocator<int>_> dummy_vector;
  
  auStack_28 = (undefined1  [8])0x0;
  dummy_vector.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  dummy_vector.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  export_pattern_internal
            (this,aggressors,base_period,addresses,(vector<int,_std::allocator<int>_> *)auStack_28);
  if (auStack_28 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_28,
                    (long)dummy_vector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)auStack_28);
  }
  return;
}

Assistant:

void PatternAddressMapper::export_pattern(
    std::vector<Aggressor> &aggressors, int base_period, std::vector<volatile char *> &addresses) {
  std::vector<int> dummy_vector;
  export_pattern_internal(aggressors, base_period, addresses, dummy_vector);
}